

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFile.c
# Opt level: O2

deBool deFile_setFlags(deFile *file,deUint32 flags)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = 0;
  uVar1 = fcntl(file->fd,3,0);
  iVar2 = fcntl(file->fd,4,(ulong)((flags & 1) << 0xb | uVar1 & 0xfffff7ff));
  if (iVar2 == 0) {
    uVar1 = fcntl(file->fd,1,0);
    iVar2 = fcntl(file->fd,2,(ulong)(flags >> 1 & 1 | uVar1 & 0xfffffffe));
    uVar3 = (uint)(iVar2 == 0);
  }
  return uVar3;
}

Assistant:

deBool deFile_setFlags (deFile* file, deUint32 flags)
{
	/* Non-blocking. */
	{
		int oldFlags = fcntl(file->fd, F_GETFL, 0);
		int newFlags = (flags & DE_FILE_NONBLOCKING) ? (oldFlags | O_NONBLOCK) : (oldFlags & ~O_NONBLOCK);
		if (fcntl(file->fd, F_SETFL, newFlags) != 0)
			return DE_FALSE;
	}

	/* Close on exec. */
	{
		int oldFlags = fcntl(file->fd, F_GETFD, 0);
		int newFlags = (flags & DE_FILE_CLOSE_ON_EXEC) ? (oldFlags | FD_CLOEXEC) : (oldFlags & ~FD_CLOEXEC);
		if (fcntl(file->fd, F_SETFD, newFlags) != 0)
			return DE_FALSE;
	}

	return DE_TRUE;
}